

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  __type _Var2;
  int iVar3;
  int iVar4;
  Extrapolation EVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  char *pcVar7;
  ostream *poVar8;
  Header *pHVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  invalid_argument *piVar11;
  LevelRoundingMode LVar12;
  int iVar13;
  ulong uVar14;
  LevelMode local_288;
  LevelRoundingMode local_284;
  allocator<char> local_279;
  Compression local_278;
  int local_274;
  long local_270;
  long local_268;
  char *local_260;
  Compression c;
  undefined8 local_250;
  long local_248;
  undefined8 local_240;
  undefined8 local_238;
  MultiPartInputFile input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  doNotFilter;
  stringstream e;
  ostream local_1a8 [376];
  
  doNotFilter._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &doNotFilter._M_t._M_impl.super__Rb_tree_header._M_header;
  doNotFilter._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  doNotFilter._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  doNotFilter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  doNotFilter._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       doNotFilter._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (argc < 2) {
    anon_unknown.dwarf_fc8e::usageMessage((ostream *)&std::cerr,*argv,false);
  }
  else {
    iVar3 = argc + -2;
    local_274 = argc + -3;
    local_270 = 0;
    local_278 = ZIP_COMPRESSION;
    local_248 = 0x40;
    local_268 = 0x40;
    local_238 = 1;
    local_240 = 1;
    local_250 = 0;
    local_284 = ROUND_DOWN;
    local_288 = ONE_LEVEL;
    local_260 = (char *)0x0;
    pcVar7 = (char *)0x0;
    uVar14 = 1;
    while (pcVar1 = local_260, iVar13 = (int)uVar14, iVar13 < argc) {
      pcVar1 = argv[uVar14];
      if (*pcVar1 == '-') {
        if ((pcVar1[1] == 'o') && (pcVar1[2] == '\0')) {
          local_288 = ONE_LEVEL;
          pcVar1 = local_260;
          goto LAB_00105697;
        }
        if ((pcVar1[1] == 'm') && (pcVar1[2] == '\0')) {
          local_288 = MIPMAP_LEVELS;
LAB_001056b9:
          LVar12 = ROUND_UP;
        }
        else {
          if ((pcVar1[1] == 'r') && (pcVar1[2] == '\0')) {
            local_288 = RIPMAP_LEVELS;
            goto LAB_001056b9;
          }
          if ((pcVar1[1] == 'f') && (pcVar1[2] == '\0')) {
            if (iVar3 < iVar13) {
              piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument(piVar11,"missing filter value with -f option")
              ;
              goto LAB_00105d22;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&e,argv[uVar14 + 1],(allocator<char> *)&input);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&doNotFilter,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
            pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e;
LAB_00105834:
            std::__cxx11::string::~string((string *)pbVar10);
            LVar12 = NUM_ROUNDINGMODES;
          }
          else if ((pcVar1[1] == 'e') && (pcVar1[2] == '\0')) {
            if (local_274 < iVar13) {
              piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument
                        (piVar11,"missing extrapolation values with -e option");
              goto LAB_00105d22;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&e,argv[uVar14 + 1],(allocator<char> *)&input);
            EVar5 = anon_unknown.dwarf_fc8e::getExtrapolation((string *)&e);
            local_238 = CONCAT44(extraout_var,EVar5);
            std::__cxx11::string::~string((string *)&e);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&e,argv[uVar14 + 2],(allocator<char> *)&input);
            EVar5 = anon_unknown.dwarf_fc8e::getExtrapolation((string *)&e);
            local_240 = CONCAT44(extraout_var_00,EVar5);
            std::__cxx11::string::~string((string *)&e);
            LVar12 = NUM_ROUNDINGMODES|ROUND_UP;
          }
          else {
            if ((pcVar1[1] == 't') && (pcVar1[2] == '\0')) {
              if (local_274 < iVar13) {
                piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
                std::invalid_argument::invalid_argument(piVar11,"missing tile size with -t option");
              }
              else {
                lVar6 = strtol(argv[uVar14 + 1],(char **)0x0,0);
                local_268 = strtol(argv[uVar14 + 2],(char **)0x0,0);
                local_248 = lVar6;
                if (0 < (int)lVar6) {
                  LVar12 = NUM_ROUNDINGMODES|ROUND_UP;
                  if (0 < (int)local_268) goto LAB_0010569a;
                }
                piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
                std::invalid_argument::invalid_argument
                          (piVar11,"Tile size must be greater than zero");
              }
              goto LAB_00105d22;
            }
            if ((pcVar1[1] == 'd') && (pcVar1[2] == '\0')) {
              local_284 = ROUND_DOWN;
              pcVar1 = local_260;
              goto LAB_00105697;
            }
            if ((pcVar1[1] == 'u') && (pcVar1[2] == '\0')) {
              LVar12 = ROUND_UP;
              local_284 = LVar12;
            }
            else {
              if ((pcVar1[1] == 'z') && (pcVar1[2] == '\0')) {
                if (iVar13 <= iVar3) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_208,argv[uVar14 + 1],&local_279);
                  Imf_3_4::getCompressionIdFromName((string *)&local_208,&c);
                  local_278 = c;
                  pbVar10 = &local_208;
                  if (c == NUM_COMPRESSION_METHODS) {
                    std::__cxx11::stringstream::stringstream((stringstream *)&e);
                    poVar8 = std::operator<<(local_1a8,"Unknown compression method \"");
                    poVar8 = std::operator<<(poVar8,(string *)&local_208);
                    std::operator<<(poVar8,"\"");
                    piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
                    std::__cxx11::stringbuf::str();
                    std::invalid_argument::invalid_argument(piVar11,(string *)&input);
                    __cxa_throw(piVar11,&std::invalid_argument::typeinfo,
                                std::invalid_argument::~invalid_argument);
                  }
                  goto LAB_00105834;
                }
                piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
                std::invalid_argument::invalid_argument
                          (piVar11,"Missing compression value with -z option");
                goto LAB_00105d22;
              }
              if ((pcVar1[1] == 'v') && (pcVar1[2] == '\0')) {
                local_250 = CONCAT71((int7)((ulong)argv >> 8),1);
                pcVar1 = local_260;
                goto LAB_00105697;
              }
              if ((pcVar1[1] != 'p') || (pcVar1[2] != '\0')) {
                if ((pcVar1[1] != 'h') || (pcVar1[2] != '\0')) goto LAB_00105654;
                goto LAB_001058d6;
              }
              if (iVar3 < iVar13) {
                piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
                std::invalid_argument::invalid_argument(piVar11,"Missing part num with -p option");
                goto LAB_00105d22;
              }
              local_270 = strtol(argv[uVar14 + 1],(char **)0x0,0);
              poVar8 = std::operator<<((ostream *)&std::cout,"part number: ");
              poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,(int)local_270);
              std::endl<char,std::char_traits<char>>(poVar8);
              LVar12 = NUM_ROUNDINGMODES;
            }
          }
        }
      }
      else {
LAB_00105654:
        iVar4 = strcmp(pcVar1,"--help");
        if (iVar4 == 0) {
LAB_001058d6:
          anon_unknown.dwarf_fc8e::usageMessage((ostream *)&std::cout,"exrmaketiled",true);
          goto LAB_00105ab8;
        }
        iVar4 = strcmp(pcVar1,"--version");
        if (iVar4 == 0) {
          pcVar7 = (char *)Imf_3_4::getLibraryVersion();
          poVar8 = std::operator<<((ostream *)&std::cout,"exrmaketiled (OpenEXR) ");
          std::operator<<(poVar8,"3.4.0");
          iVar3 = strcmp(pcVar7,"3.4.0");
          if (iVar3 != 0) {
            poVar8 = std::operator<<((ostream *)&std::cout,"(OpenEXR version ");
            poVar8 = std::operator<<(poVar8,pcVar7);
            std::operator<<(poVar8,")");
          }
          poVar8 = std::operator<<((ostream *)&std::cout," https://openexr.com");
          std::endl<char,std::char_traits<char>>(poVar8);
          poVar8 = std::operator<<((ostream *)&std::cout,
                                   "Copyright (c) Contributors to the OpenEXR Project");
          std::endl<char,std::char_traits<char>>(poVar8);
          poVar8 = std::operator<<((ostream *)&std::cout,"License BSD-3-Clause");
          std::endl<char,std::char_traits<char>>(poVar8);
          goto LAB_00105ab8;
        }
        if (pcVar7 == (char *)0x0) {
          pcVar7 = pcVar1;
          pcVar1 = local_260;
        }
LAB_00105697:
        local_260 = pcVar1;
        LVar12 = ROUND_UP;
      }
LAB_0010569a:
      uVar14 = (ulong)(iVar13 + LVar12);
    }
    if (local_260 != (char *)0x0 && pcVar7 != (char *)0x0) {
      iVar3 = strcmp(pcVar7,local_260);
      if (iVar3 == 0) {
        piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar11,"Input and output cannot be the same file");
LAB_00105d22:
        __cxa_throw(piVar11,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      iVar3 = Imf_3_4::globalThreadCount();
      lVar6 = local_270;
      Imf_3_4::MultiPartInputFile::MultiPartInputFile(&input,pcVar7,iVar3,true);
      iVar3 = Imf_3_4::MultiPartInputFile::parts();
      iVar13 = (int)lVar6;
      if ((iVar13 < 0) || (iVar3 <= iVar13)) {
        std::__cxx11::stringstream::stringstream((stringstream *)&e);
        poVar8 = std::operator<<(local_1a8,"You asked for part ");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,(int)local_270);
        poVar8 = std::operator<<(poVar8," in ");
        poVar8 = std::operator<<(poVar8,pcVar7);
        poVar8 = std::operator<<(poVar8,", which only has ");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar3);
        std::operator<<(poVar8," parts");
        piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::invalid_argument::invalid_argument(piVar11,(string *)&local_208);
        __cxa_throw(piVar11,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      pHVar9 = (Header *)Imf_3_4::MultiPartInputFile::header((int)&input);
      Imf_3_4::Header::Header((Header *)&e,pHVar9);
      pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                Imf_3_4::Header::type_abi_cxx11_();
      _Var2 = std::operator==(pbVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)Imf_3_4::DEEPTILE_abi_cxx11_);
      if (_Var2) {
LAB_00105b57:
        piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar11,"Cannot make tile for deep data");
        __cxa_throw(piVar11,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                Imf_3_4::Header::type_abi_cxx11_();
      _Var2 = std::operator==(pbVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)Imf_3_4::DEEPSCANLINE_abi_cxx11_);
      if (_Var2) goto LAB_00105b57;
      Imf_3_4::Header::~Header((Header *)&e);
      Imf_3_4::MultiPartInputFile::~MultiPartInputFile(&input);
      makeTiled(pcVar7,pcVar1,iVar13,local_288,local_284,local_278,(int)local_248,(int)local_268,
                &doNotFilter,(Extrapolation)local_238,(Extrapolation)local_240,
                (bool)((byte)local_250 & 1));
LAB_00105ab8:
      iVar3 = 0;
      goto LAB_00105aba;
    }
    anon_unknown.dwarf_fc8e::usageMessage((ostream *)&std::cerr,*argv,false);
  }
  iVar3 = -1;
LAB_00105aba:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&doNotFilter._M_t);
  return iVar3;
}

Assistant:

int
main (int argc, char** argv)
{
    const char*       inFile       = 0;
    const char*       outFile      = 0;
    LevelMode         mode         = ONE_LEVEL;
    LevelRoundingMode roundingMode = ROUND_DOWN;
    Compression       compression  = ZIP_COMPRESSION;
    int               tileSizeX    = 64;
    int               tileSizeY    = 64;
    set<string>       doNotFilter;
    Extrapolation     extX    = CLAMP;
    Extrapolation     extY    = CLAMP;
    bool              verbose = false;

    //
    // Parse the command line.
    //

    if (argc < 2)
    {
        usageMessage (cerr, argv[0], false);
        return -1;
    }

    try
    {
        int i       = 1;
        int partnum = 0;

        while (i < argc)
        {
            if (!strcmp (argv[i], "-o"))
            {
                //
                // generate a ONE_LEVEL image
                //

                mode = ONE_LEVEL;
                i += 1;
            }
            else if (!strcmp (argv[i], "-m"))
            {
                //
                // Generate a MIPMAP_LEVELS image
                //

                mode = MIPMAP_LEVELS;
                i += 1;
            }
            else if (!strcmp (argv[i], "-r"))
            {
                //
                // Generate a RIPMAP_LEVELS image
                //

                mode = RIPMAP_LEVELS;
                i += 1;
            }
            else if (!strcmp (argv[i], "-f"))
            {
                //
                // Don't low-pass filter the specified image channel
                //

                if (i > argc - 2)
                    throw invalid_argument (
                        "missing filter value with -f option");

                doNotFilter.insert (argv[i + 1]);
                i += 2;
            }
            else if (!strcmp (argv[i], "-e"))
            {
                //
                // Set x and y extrapolation method
                //

                if (i > argc - 3)
                    throw invalid_argument (
                        "missing extrapolation values with -e option");

                extX = getExtrapolation (argv[i + 1]);
                extY = getExtrapolation (argv[i + 2]);
                i += 3;
            }
            else if (!strcmp (argv[i], "-t"))
            {
                //
                // Set tile size
                //

                if (i > argc - 3)
                    throw invalid_argument ("missing tile size with -t option");

                tileSizeX = strtol (argv[i + 1], 0, 0);
                tileSizeY = strtol (argv[i + 2], 0, 0);

                if (tileSizeX <= 0 || tileSizeY <= 0)
                    throw invalid_argument (
                        "Tile size must be greater than zero");

                i += 3;
            }
            else if (!strcmp (argv[i], "-d"))
            {
                //
                // Round down
                //

                roundingMode = ROUND_DOWN;
                i += 1;
            }
            else if (!strcmp (argv[i], "-u"))
            {
                //
                // Round down
                //

                roundingMode = ROUND_UP;
                i += 1;
            }
            else if (!strcmp (argv[i], "-z"))
            {
                //
                // Set compression method
                //

                if (i > argc - 2)
                    throw invalid_argument (
                        "Missing compression value with -z option");

                compression = getCompression (argv[i + 1]);
                i += 2;
            }
            else if (!strcmp (argv[i], "-v"))
            {
                //
                // Verbose mode
                //

                verbose = true;
                i += 1;
            }
            else if (!strcmp (argv[i], "-p"))
            {
                getPartNum (argc, argv, i, &partnum);
            }
            else if (!strcmp (argv[i], "-h") || !strcmp (argv[i], "--help"))
            {
                //
                // Print help message
                //

                usageMessage (cout, "exrmaketiled", true);
                return 0;
            }
            else if (!strcmp (argv[i], "--version"))
            {
                const char* libraryVersion = getLibraryVersion ();

                cout << "exrmaketiled (OpenEXR) " << OPENEXR_VERSION_STRING;
                if (strcmp (libraryVersion, OPENEXR_VERSION_STRING))
                    cout << "(OpenEXR version " << libraryVersion << ")";
                cout << " https://openexr.com" << endl;
                cout << "Copyright (c) Contributors to the OpenEXR Project"
                     << endl;
                cout << "License BSD-3-Clause" << endl;
                return 0;
            }
            else
            {
                //
                // Image file name
                //

                if (inFile == 0)
                    inFile = argv[i];
                else
                    outFile = argv[i];

                i += 1;
            }
        }

        if (inFile == 0 || outFile == 0)
        {
            usageMessage (cerr, argv[0], false);
            return -1;
        }

        if (!strcmp (inFile, outFile))
            throw invalid_argument ("Input and output cannot be the same file");

        //
        // Load inFile, and save a tiled version in outFile.
        //

        //
        // check input
        //
        {
            MultiPartInputFile input (inFile);
            int                parts = input.parts ();

            if (partnum < 0 || partnum >= parts)
            {
                std::stringstream e;
                e << "You asked for part " << partnum << " in " << inFile
                  << ", which only has " << parts << " parts";
                throw invalid_argument (e.str ());
            }

            Header h = input.header (partnum);
            if (h.type () == DEEPTILE || h.type () == DEEPSCANLINE)
                throw invalid_argument ("Cannot make tile for deep data");
        }

        makeTiled (
            inFile,
            outFile,
            partnum,
            mode,
            roundingMode,
            compression,
            tileSizeX,
            tileSizeY,
            doNotFilter,
            extX,
            extY,
            verbose);
    }
    catch (const exception& e)
    {
        cerr << argv[0] << ": " << e.what () << endl;
        return 1;
    }

    return 0;
}